

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# supdup.c
# Opt level: O1

char * supdup_init(BackendVtable *x,Seat *seat,Backend **backend_handle,LogContext *logctx,
                  Conf *conf,char *host,int port,char **realhost,_Bool nodelay,_Bool keepalive)

{
  int iVar1;
  char **ppcVar2;
  _Bool _Var3;
  _Bool _Var4;
  int iVar5;
  uint uVar6;
  undefined8 *__s;
  Conf *conf_00;
  char *pcVar7;
  SockAddr *addr;
  Socket *pSVar8;
  Pinger *pPVar9;
  char *pcVar10;
  ulong uVar11;
  long lVar12;
  char sixBits;
  char sixBits_1;
  char sixBits_2;
  char sixBits_3;
  char sixBits_4;
  char sixBits_5;
  Seat *local_58;
  Backend *local_50;
  Interactor *local_48;
  Backend **local_40;
  char **local_38;
  
  local_38 = realhost;
  local_58 = seat;
  local_40 = backend_handle;
  __s = (undefined8 *)safemalloc(1,0xc0,0);
  memset(__s,0,0xc0);
  __s[0x12] = &supdup_init::fn_table;
  __s[0x13] = &supdup_backend;
  local_48 = (Interactor *)(__s + 0x15);
  __s[0x15] = &Supdup_interactorvt;
  __s[0x14] = local_48;
  __s[3] = logctx;
  conf_00 = conf_copy(conf);
  __s[0xb] = conf_00;
  *__s = 0;
  *(undefined2 *)(__s + 1) = 0;
  __s[2] = local_58;
  iVar5 = conf_get_int(conf_00,0x7d);
  *(int *)(__s + 5) = iVar5;
  iVar5 = conf_get_int((Conf *)__s[0xb],0x7e);
  *(int *)((long)__s + 0x2c) = iVar5;
  __s[0x11] = 0;
  *(undefined1 *)(__s + 10) = 0;
  local_58 = (Seat *)CONCAT44(local_58._4_4_,port);
  pcVar7 = default_description((BackendVtable *)__s[0x13],host,port);
  __s[6] = pcVar7;
  *local_40 = (Backend *)(__s + 0x13);
  local_50 = (Backend *)(__s + 0x13);
  uVar6 = conf_get_int((Conf *)__s[0xb],0x45);
  if (uVar6 < 3) {
    __s[0x10] = (&PTR_print_ascii_001a8310)[uVar6];
  }
  iVar5 = conf_get_int((Conf *)__s[0xb],3);
  pcVar7 = " (IPv6)";
  if (iVar5 != 2) {
    pcVar7 = anon_var_dwarf_32abb + 10;
  }
  pcVar10 = " (IPv4)";
  if (iVar5 != 1) {
    pcVar10 = pcVar7;
  }
  pcVar7 = dupprintf("Looking up host \"%s\"%s",host,pcVar10);
  logevent((LogContext *)__s[3],pcVar7);
  safefree(pcVar7);
  ppcVar2 = local_38;
  iVar1 = (int)local_58;
  addr = name_lookup(host,(int)local_58,local_38,(Conf *)__s[0xb],iVar5,(LogContext *)0x0,
                     anon_var_dwarf_32abb + 10);
  pcVar7 = sk_addr_error(addr);
  if (pcVar7 == (char *)0x0) {
    iVar5 = 0x5f;
    if (-1 < iVar1) {
      iVar5 = iVar1;
    }
    pSVar8 = new_connection(addr,*ppcVar2,iVar5,false,true,nodelay,keepalive,(Plug *)(__s + 0x12),
                            (Conf *)__s[0xb],local_48);
    *__s = pSVar8;
    pcVar7 = (*pSVar8->vt->socket_error)(pSVar8);
    if (pcVar7 == (char *)0x0) {
      pPVar9 = pinger_new((Conf *)__s[0xb],local_50);
      __s[0x11] = pPVar9;
      (**(code **)(*(long *)__s[2] + 0x48))();
      pcVar7 = conf_get_str((Conf *)__s[0xb],9);
      if (*pcVar7 != '\0') {
        safefree(*ppcVar2);
        pcVar7 = dupstr(pcVar7);
        *ppcVar2 = pcVar7;
        pcVar7 = host_strrchr(pcVar7,0x3a);
        if (pcVar7 != (char *)0x0) {
          *pcVar7 = '\0';
        }
      }
      iVar5 = conf_get_int((Conf *)__s[0xb],0x45);
      _Var3 = conf_get_bool((Conf *)__s[0xb],0x46);
      _Var4 = conf_get_bool((Conf *)__s[0xb],0x47);
      uVar11 = 0x1744c0028;
      if (iVar5 == 0) {
        uVar11 = 0x1444c0028;
      }
      __s[7] = uVar11 | (uint)_Var3 << 0x19 | (ulong)_Var4 << 0x18;
      __s[9] = (long)*(int *)(__s + 5) + -1;
      __s[8] = (long)*(int *)((long)__s + 0x2c);
      lVar12 = 0x1e;
      do {
        sixBits = (byte)(0xfffec0000 >> ((byte)lVar12 & 0x3f)) & 0x3f;
        (**(code **)(*(long *)*__s + 0x10))((long *)*__s,&sixBits,1);
        lVar12 = lVar12 + -6;
      } while (lVar12 != -6);
      lVar12 = 0x1e;
      do {
        sixBits_1 = (char)(7L >> ((byte)lVar12 & 0x3f));
        (**(code **)(*(long *)*__s + 0x10))((long *)*__s,&sixBits_1,1);
        lVar12 = lVar12 + -6;
      } while (lVar12 != -6);
      uVar11 = __s[7];
      lVar12 = 0x1e;
      do {
        sixBits_2 = (byte)(uVar11 >> ((byte)lVar12 & 0x3f)) & 0x3f;
        (**(code **)(*(long *)*__s + 0x10))((long *)*__s,&sixBits_2,1);
        lVar12 = lVar12 + -6;
      } while (lVar12 != -6);
      uVar11 = __s[8];
      lVar12 = 0x1e;
      do {
        sixBits_3 = (byte)(uVar11 >> ((byte)lVar12 & 0x3f)) & 0x3f;
        (**(code **)(*(long *)*__s + 0x10))((long *)*__s,&sixBits_3,1);
        lVar12 = lVar12 + -6;
      } while (lVar12 != -6);
      uVar11 = __s[9];
      lVar12 = 0x1e;
      do {
        sixBits_4 = (byte)(uVar11 >> ((byte)lVar12 & 0x3f)) & 0x3f;
        (**(code **)(*(long *)*__s + 0x10))((long *)*__s,&sixBits_4,1);
        lVar12 = lVar12 + -6;
      } while (lVar12 != -6);
      lVar12 = 0x1e;
      do {
        sixBits_5 = (char)(1L >> ((byte)lVar12 & 0x3f));
        (**(code **)(*(long *)*__s + 0x10))((long *)*__s,&sixBits_5,1);
        lVar12 = lVar12 + -6;
      } while (lVar12 != -6);
      *(undefined4 *)((long)__s + 100) = 0;
      (**(code **)(*(long *)__s[2] + 0xb0))((long *)__s[2],0);
      uVar11 = (*(code *)**(undefined8 **)__s[2])((undefined8 *)__s[2],0,"\x1b%G",3);
      (**(code **)(*(long *)*__s + 0x28))((long *)*__s,0x1000 < uVar11);
      return (char *)0x0;
    }
  }
  else {
    sk_addr_free(addr);
  }
  pcVar7 = dupstr(pcVar7);
  return pcVar7;
}

Assistant:

static char *supdup_init(const BackendVtable *x, Seat *seat,
                         Backend **backend_handle,
                         LogContext *logctx, Conf *conf,
                         const char *host, int port, char **realhost,
                         bool nodelay, bool keepalive)
{
    static const PlugVtable fn_table = {
        .log = supdup_log,
        .closing = supdup_closing,
        .receive = supdup_receive,
        .sent = supdup_sent,
    };
    SockAddr *addr;
    const char *err;
    Supdup *supdup;
    char *loghost;
    int addressfamily;
    const char *utf8 = "\033%G";

    supdup = snew(struct supdup_tag);
    memset(supdup, 0, sizeof(Supdup));
    supdup->plug.vt = &fn_table;
    supdup->backend.vt = &supdup_backend;
    supdup->interactor.vt = &Supdup_interactorvt;
    supdup->backend.interactor = &supdup->interactor;
    supdup->logctx = logctx;
    supdup->conf = conf_copy(conf);
    supdup->s = NULL;
    supdup->socket_connected = false;
    supdup->closed_on_socket_error = false;
    supdup->seat = seat;
    supdup->term_width = conf_get_int(supdup->conf, CONF_width);
    supdup->term_height = conf_get_int(supdup->conf, CONF_height);
    supdup->pinger = NULL;
    supdup->sent_location = false;
    supdup->description = default_description(supdup->backend.vt, host, port);
    *backend_handle = &supdup->backend;

    switch (conf_get_int(supdup->conf, CONF_supdup_ascii_set)) {
    case SUPDUP_CHARSET_ASCII:
      supdup->print = print_ascii;
      break;
    case SUPDUP_CHARSET_ITS:
      supdup->print = print_its;
      break;
    case SUPDUP_CHARSET_WAITS:
      supdup->print = print_waits;
      break;
    }

    /*
     * Try to find host.
     */
    {
        char *buf;
        addressfamily = conf_get_int(supdup->conf, CONF_addressfamily);
        buf = dupprintf("Looking up host \"%s\"%s", host,
                        (addressfamily == ADDRTYPE_IPV4 ? " (IPv4)" :
                         (addressfamily == ADDRTYPE_IPV6 ? " (IPv6)" :
                          "")));
        logevent(supdup->logctx, buf);
        sfree(buf);
    }
    addr = name_lookup(host, port, realhost, supdup->conf, addressfamily, NULL, "");
    if ((err = sk_addr_error(addr)) != NULL) {
        sk_addr_free(addr);
        return dupstr(err);
    }

    if (port < 0)
        port = 0137;            /* default supdup port */

    /*
     * Open socket.
     */
    supdup->s = new_connection(addr, *realhost, port, false, true,
                               nodelay, keepalive, &supdup->plug, supdup->conf,
                               &supdup->interactor);
    if ((err = sk_socket_error(supdup->s)) != NULL)
        return dupstr(err);

    supdup->pinger = pinger_new(supdup->conf, &supdup->backend);

    /*
     * We can send special commands from the start.
     */
    seat_update_specials_menu(supdup->seat);

    /*
     * loghost overrides realhost, if specified.
     */
    loghost = conf_get_str(supdup->conf, CONF_loghost);
    if (*loghost) {
        char *colon;

        sfree(*realhost);
        *realhost = dupstr(loghost);

        colon = host_strrchr(*realhost, ':');
        if (colon)
            *colon++ = '\0';
    }

    /*
     * Set up TTYOPTS based on config
     */
    int ascii_set = conf_get_int(supdup->conf, CONF_supdup_ascii_set);
    int more_processing = conf_get_bool(supdup->conf, CONF_supdup_more);
    int scrolling = conf_get_bool(supdup->conf, CONF_supdup_scroll);
    supdup->ttyopt =
        TOERS |
        TOMVB |
        (ascii_set == SUPDUP_CHARSET_ASCII ? 0 : TOSAI | TOSA1) |
        TOMVU |
        TOLWR |
        TOLID |
        TOCID |
        TPCBS |
        (scrolling ? TOROL : 0) |
        (more_processing ? TOMOR : 0) |
        TPORS;

    supdup->tcmxh = supdup->term_width - 1;             // -1 "..one column is used to indicate line continuation."
    supdup->tcmxv = supdup->term_height;

    /*
     * Send our configuration words to the server
     */
    supdup_send_config(supdup);

    /*
     * We next expect a connection message followed by %TDNOP from the server
     */
    supdup->state = CONNECTING;
    seat_set_trust_status(supdup->seat, false);

    /* Make sure the terminal is in UTF-8 mode. */
    c_write(supdup, (unsigned char *)utf8, strlen(utf8));

    return NULL;
}